

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToFloatingPoint<float>(floating_point<float> *f,iu_ostream *os)

{
  undefined8 uVar1;
  UInt value;
  ostream *poVar2;
  iu_ostream *local_218;
  string local_1f8;
  string local_1d8 [32];
  float local_1b8 [5];
  int local_1a4;
  stringstream local_1a0 [8];
  iu_stringstream ss;
  iu_ostream *os_local;
  floating_point<float> *f_local;
  
  ss._384_8_ = os;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = (int)std::setprecision(8);
  std::operator<<((ostream *)&ss.field_0x8,(_Setprecision)local_1a4);
  local_1b8[0] = floating_point<float>::raw(f);
  local_218 = (iu_ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_218 = (iu_ostream *)&ss.field_0x8;
  }
  UniversalPrint<float>(local_1b8,local_218);
  uVar1 = ss._384_8_;
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)uVar1,local_1d8);
  poVar2 = std::operator<<(poVar2,"(0x");
  value = floating_point<float>::bits(f);
  ToHexString<unsigned_int>(&local_1f8,value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}